

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

htab_hash_t macro_hash(macro_t macro,void *arg)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t *v;
  ulong *__s;
  ulong uVar11;
  
  __s = (ulong *)macro->id->repr;
  uVar8 = strlen((char *)__s);
  uVar9 = uVar8 + 0x42;
  for (; 0xf < uVar8; uVar8 = uVar8 - 0x10) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *__s;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = __s[1];
    uVar9 = SUB168(ZEXT816(0x288eea216831e6a7) * auVar6,8) +
            SUB168(ZEXT816(0x288eea216831e6a7) * auVar6,0) ^
            SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar5,8) +
            SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar5,0) ^ uVar9;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar9;
    uVar9 = SUB168(auVar1 * ZEXT816(0x65862b62bdf5ef4d),8) +
            SUB168(auVar1 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar9;
    __s = __s + 2;
  }
  if (7 < uVar8) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *__s;
    uVar9 = uVar9 ^ SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar7,8) +
                    SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar7,0);
    uVar8 = uVar8 - 8;
    __s = __s + 1;
  }
  if (uVar8 != 0) {
    if (uVar8 == 8) {
      uVar10 = *__s;
    }
    else {
      if (uVar8 < 4) {
        uVar11 = 0;
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)(uint)*__s << 0x20;
        uVar11 = 4;
      }
      if (uVar11 < uVar8) {
        do {
          uVar10 = uVar10 >> 8 | (ulong)*(byte *)((long)__s + uVar11) << 0x38;
          uVar11 = uVar11 + 1;
        } while (uVar8 != uVar11);
      }
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar10;
    uVar9 = uVar9 ^ SUB168(auVar2 * ZEXT816(0x288eea216831e6a7),8) +
                    SUB168(auVar2 * ZEXT816(0x288eea216831e6a7),0);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar9;
  uVar9 = SUB168(auVar3 * ZEXT816(0x65862b62bdf5ef4d),8) +
          SUB168(auVar3 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar9;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar9;
  return (uint)uVar9 ^
         SUB164(auVar4 * ZEXT816(0x288eea216831e6a7),8) +
         SUB164(auVar4 * ZEXT816(0x288eea216831e6a7),0);
}

Assistant:

static htab_hash_t macro_hash (macro_t macro, void *arg MIR_UNUSED) {
  return (htab_hash_t) mir_hash (macro->id->repr, strlen (macro->id->repr), 0x42);
}